

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beectl.c
# Opt level: O3

char * get_alternative_editor(void)

{
  long lVar1;
  char *pcVar2;
  
  pcVar2 = "gvim";
  lVar1 = 0x10;
  do {
    pcVar2 = which(pcVar2,*(size_t *)((long)&__do_global_dtors_aux_fini_array_entry + lVar1));
    if (pcVar2 != (char *)0x0) {
      return pcVar2;
    }
    pcVar2 = *(char **)((long)&PTR_anon_var_dwarf_2f4_00108d60 + lVar1);
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x70);
  return (char *)0x0;
}

Assistant:

static char *
get_alternative_editor ()
{
  char *editor = NULL;
  const str_t fallback_editors[] = {
#ifdef WINDOWS
        { .name = "gedit.exe",        .size = sizeof ("gedit.exe")        },
        { .name = "sublime_text.exe", .size = sizeof ("sublime_text.exe") },
        { .name = "notepad++.exe",    .size = sizeof ("notepad++.exe")    },
        { .name = "notepad.exe",      .size = sizeof ("notepad.exe")      },
#else
        { .name = "gvim",     .size = sizeof ("gvim")     },
        { .name = "sublime",  .size = sizeof ("sublime")  },
        { .name = "gedit",    .size = sizeof ("gedit")    },
        { .name = "kate",     .size = sizeof ("kate")     },
        { .name = "mousepad", .size = sizeof ("mousepad") },
        { .name = "leafpad",  .size = sizeof ("leafpad")  },
#endif
        { .name = NULL, .size = 0 },
  };

  for (unsigned i = 0; fallback_editors[i].name != NULL; i++)
    {
      editor = which (fallback_editors[i].name, fallback_editors[i].size);
      if (editor != NULL)
        return editor;
    }

  return NULL;
}